

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O1

SquareMatrix<double> __thiscall
qclab::qgates::QControlledGate2<double>::matrix(QControlledGate2<double> *this)

{
  _Head_base<0UL,_double_*,_false> _Var1;
  int iVar2;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> _Var3;
  long *plVar4;
  int64_t i;
  long lVar5;
  _Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_> extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  double *extraout_RDX_02;
  double *extraout_RDX_03;
  _Head_base<0UL,_double_*,_false> extraout_RDX_04;
  double *extraout_RDX_05;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> extraout_RDX_06;
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX_07;
  long *in_RSI;
  pointer *__ptr;
  data_type *pdVar7;
  SquareMatrix<double> SVar8;
  matrix_type E1;
  matrix_type E0;
  matrix_type CG;
  matrix_type I2;
  SquareMatrix<double> local_b0;
  SquareMatrix<double> local_a0;
  SquareMatrix<double> local_90;
  SquareMatrix<double> local_80;
  SquareMatrix<double> local_70;
  SquareMatrix<double> local_60;
  SquareMatrix<double> local_50;
  SquareMatrix<double> local_40;
  SquareMatrix<double> local_30;
  _Head_base<0UL,_double_*,_false> _Var6;
  
  local_70.size_ = 2;
  local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined8 *)
   local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0;
  lVar5 = 0;
  _Var3._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (tuple<double_*,_std::default_delete<double[]>_>)
       local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  do {
    *(undefined8 *)
     _Var3._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
     super__Head_base<0UL,_double_*,_false>._M_head_impl = 0x3ff0000000000000;
    lVar5 = lVar5 + 1;
    _Var3._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         ((long)_Var3._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18);
  } while (lVar5 != 2);
  local_90.size_ = 2;
  local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined8 *)
   local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0;
  local_a0.size_ = 2;
  local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(0x20);
  *(undefined8 *)
   local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0x3ff0000000000000;
  plVar4 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar4 + 0x38))(&local_80,plVar4);
  lVar5 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar5 < iVar2) {
      dense::kron<double>((dense *)&local_30,&local_90,&local_80);
      dense::kron<double>((dense *)&local_b0,&local_a0,&local_70);
      SVar8 = dense::operator+((dense *)this,&local_30,&local_b0);
      _Var6._M_head_impl =
           (double *)
           SVar8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_double_*,_false>)
          local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl !=
          (_Head_base<0UL,_double_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_00;
      }
      pdVar7 = &local_30.data_;
    }
    else {
      dense::kron<double>((dense *)&local_40,&local_80,&local_90);
      dense::kron<double>((dense *)&local_b0,&local_70,&local_a0);
      SVar8 = dense::operator+((dense *)this,&local_40,&local_b0);
      _Var6._M_head_impl =
           (double *)
           SVar8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_double_*,_false>)
          local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl !=
          (_Head_base<0UL,_double_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_02;
      }
      pdVar7 = &local_40.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar5 < iVar2) {
      dense::kron<double>((dense *)&local_50,&local_90,&local_70);
      dense::kron<double>((dense *)&local_b0,&local_a0,&local_80);
      SVar8 = dense::operator+((dense *)this,&local_50,&local_b0);
      _Var6._M_head_impl =
           (double *)
           SVar8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_double_*,_false>)
          local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl !=
          (_Head_base<0UL,_double_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
        _Var6 = extraout_RDX.super__Head_base<0UL,_double_*,_false>._M_head_impl;
      }
      pdVar7 = &local_50.data_;
    }
    else {
      dense::kron<double>((dense *)&local_60,&local_70,&local_90);
      dense::kron<double>((dense *)&local_b0,&local_80,&local_a0);
      SVar8 = dense::operator+((dense *)this,&local_60,&local_b0);
      _Var6._M_head_impl =
           (double *)
           SVar8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_double_*,_false>)
          local_b0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl !=
          (_Head_base<0UL,_double_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl);
        _Var6._M_head_impl = extraout_RDX_01;
      }
      pdVar7 = &local_60.data_;
    }
  }
  _Var1._M_head_impl =
       (pdVar7->_M_t).super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (double *)0x0) {
    operator_delete__(_Var1._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_03;
  }
  (pdVar7->_M_t).super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  if ((tuple<double_*,_std::default_delete<double[]>_>)
      local_80.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_80.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_04._M_head_impl;
  }
  if (local_a0.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_a0.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
    _Var6._M_head_impl = extraout_RDX_05;
  }
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_90.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_90.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
    _Var6._M_head_impl =
         (double *)
         extraout_RDX_06._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
  }
  if (local_70.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_70.data_._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
    _Var6._M_head_impl =
         (double *)
         extraout_RDX_07.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
  }
  SVar8.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)_Var6._M_head_impl;
  SVar8.size_ = (size_type_conflict)this;
  return SVar8;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }